

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.cpp
# Opt level: O2

void __thiscall xe::ri::List::~List(List *this)

{
  pointer ppIVar1;
  pointer ppIVar2;
  
  for (ppIVar2 = (this->m_items).super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppIVar2 !=
      (this->m_items).super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppIVar2 = ppIVar2 + 1) {
    if (*ppIVar2 != (Item *)0x0) {
      (*(*ppIVar2)->_vptr_Item[1])();
    }
  }
  ppIVar1 = (this->m_items).super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppIVar2 != ppIVar1) {
    (this->m_items).super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppIVar1;
  }
  std::_Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>::~_Vector_base
            ((_Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_> *)this);
  return;
}

Assistant:

List::~List (void)
{
	for (std::vector<Item*>::iterator i = m_items.begin(); i != m_items.end(); i++)
		delete *i;
	m_items.clear();
}